

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

bool Omega_h::inertia::anon_unknown_0::mark_axis_bisection
               (CommPtr *comm,Reals *distances,Reals *masses,Real total_mass,Real tolerance,
               Read<signed_char> *marked)

{
  int __x;
  shared_ptr<Omega_h::Comm> *psVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Real RVar2;
  double extraout_XMM0_Qa_01;
  MinMax<double> MVar3;
  double local_1a0;
  Read<signed_char> local_150;
  Read<double> local_140;
  shared_ptr<Omega_h::Comm> local_130;
  double local_120;
  Real half_weight;
  Read<signed_char> local_108;
  int local_f4;
  double dStack_f0;
  Int i;
  Real distance;
  double step;
  double range;
  Read<double> local_c8;
  shared_ptr<Omega_h::Comm> local_b8;
  double local_a8;
  MinMax<double> minmax_dist;
  LO n;
  Read<signed_char> *marked_local;
  Real tolerance_local;
  Real total_mass_local;
  Reals *masses_local;
  Reals *distances_local;
  CommPtr *comm_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(distances->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((distances->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(distances->write_).shared_alloc_.alloc >> 3;
  }
  minmax_dist.max._4_4_ = (int)(local_10 >> 3);
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  if (minmax_dist.max._4_4_ == (int)(local_20 >> 3)) {
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_b8,comm);
    Read<double>::Read(&local_c8,distances);
    MVar3 = get_minmax<double>(&local_b8,&local_c8);
    minmax_dist.min = MVar3.max;
    local_a8 = MVar3.min;
    Read<double>::~Read(&local_c8);
    psVar1 = &local_b8;
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(psVar1);
    __x = (int)psVar1;
    std::abs(__x);
    std::abs(__x);
    local_1a0 = extraout_XMM0_Qa;
    if (extraout_XMM0_Qa < extraout_XMM0_Qa_00) {
      local_1a0 = extraout_XMM0_Qa_00;
    }
    step = local_1a0;
    dStack_f0 = 0.0;
    local_f4 = 0;
    while( true ) {
      distance = local_1a0 / 2.0;
      if (0x33 < local_f4) {
        return false;
      }
      Read<double>::Read((Read<double> *)&half_weight,distances);
      mark_half((anon_unknown_0 *)&local_108,(Read<double> *)&half_weight,dStack_f0);
      Read<signed_char>::operator=(marked,&local_108);
      Read<signed_char>::~Read(&local_108);
      Read<double>::~Read((Read<double> *)&half_weight);
      std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_130,comm);
      Read<double>::Read(&local_140,masses);
      Read<signed_char>::Read(&local_150,marked);
      RVar2 = get_half_weight(&local_130,&local_140,&local_150);
      Read<signed_char>::~Read(&local_150);
      Read<double>::~Read(&local_140);
      psVar1 = &local_130;
      std::shared_ptr<Omega_h::Comm>::~shared_ptr(psVar1);
      local_120 = RVar2;
      std::abs((int)psVar1);
      if (extraout_XMM0_Qa_01 <= tolerance) break;
      if (local_120 <= total_mass / 2.0) {
        dStack_f0 = dStack_f0 - distance;
      }
      else {
        dStack_f0 = distance + dStack_f0;
      }
      local_f4 = local_f4 + 1;
      local_1a0 = distance;
    }
    return true;
  }
  fail("assertion %s failed at %s +%d\n","n == masses.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_inertia.cpp"
       ,0x5c);
}

Assistant:

bool mark_axis_bisection(CommPtr comm, Reals distances, Reals masses,
    Real total_mass, Real tolerance, Read<I8>& marked) {
  auto n = distances.size();
  OMEGA_H_CHECK(n == masses.size());
  auto minmax_dist = get_minmax(comm, distances);
  auto range = max2(std::abs(minmax_dist.min), std::abs(minmax_dist.max));
  auto step = range / 2.;
  Real distance = 0.;
  for (Int i = 0; i < MANTISSA_BITS; ++i) {
    marked = mark_half(distances, distance);
    auto half_weight = get_half_weight(comm, masses, marked);
    if (std::abs(half_weight - (total_mass / 2.)) <= tolerance) {
      return true;
    }
    if (half_weight > total_mass / 2.) {
      distance += step;
    } else {
      distance -= step;
    }
    step /= 2.;
  }
  return false;
}